

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

int Dtt_PrintStats(int nNodes,int nVars,Vec_Wec_t *vFunNodes,word nSteps,abctime clk,int fDelay,
                  word nMultis)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  abctime aVar3;
  undefined8 uVar4;
  int nNew;
  int fDelay_local;
  abctime clk_local;
  word nSteps_local;
  Vec_Wec_t *vFunNodes_local;
  int nVars_local;
  int nNodes_local;
  
  p = Vec_WecEntry(vFunNodes,nNodes);
  iVar1 = Vec_IntSize(p);
  uVar4 = 0x4e;
  if (fDelay != 0) {
    uVar4 = 0x44;
  }
  printf("%c =%2d  |  ",uVar4,(ulong)(uint)nNodes);
  printf("C =%12.0f  |  ",(double)(long)nSteps);
  printf("New%d =%10d   ",(ulong)(uint)nVars,(ulong)(iVar1 + (uint)(nNodes == 0)));
  iVar2 = Vec_WecSizeSize(vFunNodes);
  printf("All%d =%10d  |  ",(ulong)(uint)nVars,(ulong)(iVar2 + 1));
  printf("Multi =%10d  |  ",nMultis & 0xffffffff);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - clk);
  fflush(_stdout);
  return iVar1;
}

Assistant:

int Dtt_PrintStats( int nNodes, int nVars, Vec_Wec_t * vFunNodes, word nSteps, abctime clk, int fDelay, word nMultis )
{
    int nNew = Vec_IntSize(Vec_WecEntry(vFunNodes, nNodes));
    printf("%c =%2d  |  ",     fDelay ? 'D':'N', nNodes );
    printf("C =%12.0f  |  ",   (double)(iword)nSteps );
    printf("New%d =%10d   ",   nVars, nNew + (int)(nNodes==0) );
    printf("All%d =%10d  |  ", nVars, Vec_WecSizeSize(vFunNodes)+1 );
    printf("Multi =%10d  |  ", (int)nMultis );
    Abc_PrintTime( 1, "Time",  Abc_Clock() - clk );
    //Abc_Print(1, "%9.2f sec\n", 1.0*(Abc_Clock() - clk)/(CLOCKS_PER_SEC));
    fflush(stdout);
    return nNew;
}